

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O3

void __thiscall
rengine::AllocationPool<rengine::RectangleNode>::deallocate
          (AllocationPool<rengine::RectangleNode> *this,RectangleNode *t)

{
  uint uVar1;
  uint uVar2;
  
  if (this->m_memory == (RectangleNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x52,
                  "void rengine::AllocationPool<rengine::RectangleNode>::deallocate(T *) [T = rengine::RectangleNode]"
                 );
  }
  if (this->m_free == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x53,
                  "void rengine::AllocationPool<rengine::RectangleNode>::deallocate(T *) [T = rengine::RectangleNode]"
                 );
  }
  if (this->m_nextFree == 0) {
    __assert_fail("m_nextFree > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x54,
                  "void rengine::AllocationPool<rengine::RectangleNode>::deallocate(T *) [T = rengine::RectangleNode]"
                 );
  }
  uVar2 = (int)((ulong)((long)t - (long)this->m_memory) >> 3) * -0x45d1745d;
  if (uVar2 < this->m_poolSize) {
    uVar1 = this->m_nextFree - 1;
    this->m_nextFree = uVar1;
    this->m_free[uVar1] = uVar2;
    (**(t->super_RectangleNodeBase).super_Node.super_SignalEmitter._vptr_SignalEmitter)(t);
    return;
  }
  __assert_fail("isAlloctated(t)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x55,
                "void rengine::AllocationPool<rengine::RectangleNode>::deallocate(T *) [T = rengine::RectangleNode]"
               );
}

Assistant:

void deallocate(T *t) {
        assert(m_memory);
        assert(m_free);
        assert(m_nextFree > 0);
        assert(isAlloctated(t));

        unsigned pos = t - m_memory;

        --m_nextFree;
        m_free[m_nextFree] = pos;

        // Call the destructor...
        t->~T();
    }